

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O2

void __thiscall
Storage::Disk::IPF::add_raw_data
          (IPF *this,
          vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *track,
          Time bit_length,size_t num_bits)

{
  byte bVar1;
  reference pvVar2;
  uint uVar3;
  ulong __n;
  size_t bit;
  ulong uVar4;
  vector<bool,_std::allocator<bool>_> *this_00;
  
  pvVar2 = std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
           emplace_back<>(track);
  pvVar2->length_of_a_bit = bit_length;
  __n = num_bits + 7 & 0xfffffffffffffff8;
  this_00 = &pvVar2->data;
  std::vector<bool,_std::allocator<bool>_>::reserve(this_00,__n);
  for (uVar4 = 0; uVar4 < num_bits; uVar4 = uVar4 + 8) {
    bVar1 = FileHolder::get8(&this->file_);
    std::vector<bool,_std::allocator<bool>_>::push_back(this_00,(bool)(bVar1 >> 7));
    std::vector<bool,_std::allocator<bool>_>::push_back(this_00,SUB41((bVar1 & 0x40) >> 6,0));
    uVar3 = (uint)bVar1;
    std::vector<bool,_std::allocator<bool>_>::push_back(this_00,SUB41((uVar3 & 0x20) >> 5,0));
    std::vector<bool,_std::allocator<bool>_>::push_back(this_00,SUB41((uVar3 & 0x10) >> 4,0));
    std::vector<bool,_std::allocator<bool>_>::push_back(this_00,SUB41((uVar3 & 8) >> 3,0));
    std::vector<bool,_std::allocator<bool>_>::push_back(this_00,SUB41((uVar3 & 4) >> 2,0));
    std::vector<bool,_std::allocator<bool>_>::push_back(this_00,SUB41((bVar1 & 2) >> 1,0));
    std::vector<bool,_std::allocator<bool>_>::push_back(this_00,(bool)(bVar1 & 1));
  }
  if ((ulong)(pvVar2->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(pvVar2->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(pvVar2->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= __n) {
    std::vector<bool,_std::allocator<bool>_>::resize(this_00,num_bits,false);
    return;
  }
  __assert_fail("segment.data.size() <= num_bits_ceiling",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/IPF.cpp"
                ,0x1b5,
                "void Storage::Disk::IPF::add_raw_data(std::vector<Storage::Disk::PCMSegment> &, Time, size_t)"
               );
}

Assistant:

void IPF::add_raw_data(std::vector<Storage::Disk::PCMSegment> &track, Time bit_length, size_t num_bits) {
	auto &segment = track.emplace_back();
	segment.length_of_a_bit = bit_length;

	const auto num_bits_ceiling = size_t(num_bits + 7) & size_t(~7);
	segment.data.reserve(num_bits_ceiling);

	for(size_t bit = 0; bit < num_bits; bit += 8) {
		const uint8_t next = file_.get8();
		segment.data.push_back(next & 0x80);
		segment.data.push_back(next & 0x40);
		segment.data.push_back(next & 0x20);
		segment.data.push_back(next & 0x10);
		segment.data.push_back(next & 0x08);
		segment.data.push_back(next & 0x04);
		segment.data.push_back(next & 0x02);
		segment.data.push_back(next & 0x01);
	}

	assert(segment.data.size() <= num_bits_ceiling);
	segment.data.resize(num_bits);
}